

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_FieldJsonName_Test::
ParseMessageTest_FieldJsonName_Test(ParseMessageTest_FieldJsonName_Test *this)

{
  ParseMessageTest_FieldJsonName_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseMessageTest);
  (this->super_ParseMessageTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseMessageTest_FieldJsonName_Test_02a0a580;
  return;
}

Assistant:

TEST_F(ParseMessageTest, FieldJsonName) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  optional string foo = 1 [json_name = \"@type\"];\n"
      "}\n",
      "message_type {"
      "  name: \"TestMessage\""
      "  field {\n"
      "    name: \"foo\" label: LABEL_OPTIONAL type: TYPE_STRING number: 1"
      "    json_name: \"@type\"\n"
      "  }\n"
      "}\n");
}